

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darData.c
# Opt level: O1

Vec_Int_t * Dar_LibReadNodes(void)

{
  Vec_Int_t *p;
  int *piVar1;
  long lVar2;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x15704;
  p->nSize = 0;
  piVar1 = (int *)malloc(0x55c10);
  p->pArray = piVar1;
  lVar2 = 0;
  do {
    Vec_IntPush(p,*(int *)((long)s_Data1 + lVar2));
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x55c10);
  return p;
}

Assistant:

Vec_Int_t * Dar_LibReadNodes()
{
    Vec_Int_t * vResult;
    int i;
    vResult = Vec_IntAlloc( s_nDataSize1 );
    for ( i = 0; i < s_nDataSize1; i++ )
        Vec_IntPush( vResult, s_Data1[i] );
    return vResult;
}